

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::setSpatialMatrix
          (SpatialRigidBodyInertia *this,SpatialMatrix *mat)

{
  Scalar SVar1;
  double dVar2;
  Scalar *pSVar3;
  CoeffReturnType pdVar4;
  Scalar *in_RDI;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *in_stack_ffffffffffffff30;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *this_00;
  
  row = in_RDI[4];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (in_stack_ffffffffffffff30,(Index)row,0x820335);
  *pSVar3 = row;
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *)in_RDI[5];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x82036a);
  *pSVar3 = (Scalar)this_00;
  SVar1 = in_RDI[7];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8203a0);
  *pSVar3 = SVar1;
  SVar1 = in_RDI[5];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8203d6);
  *pSVar3 = SVar1;
  SVar1 = in_RDI[6];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x82040b);
  *pSVar3 = SVar1;
  SVar1 = in_RDI[8];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820442);
  *pSVar3 = SVar1;
  SVar1 = in_RDI[7];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820478);
  *pSVar3 = SVar1;
  SVar1 = in_RDI[8];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8204af);
  *pSVar3 = SVar1;
  SVar1 = in_RDI[9];
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8204e4);
  *pSVar3 = SVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820504);
  *pSVar3 = 0.0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820542);
  *pSVar3 = dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x82059a);
  *pSVar3 = -dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8205f1);
  *pSVar3 = -dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820612);
  *pSVar3 = 0.0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x82064f);
  *pSVar3 = dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x82068f);
  *pSVar3 = dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8206e6);
  *pSVar3 = -dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820707);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820724);
  *pSVar3 = 0.0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820778);
  *pSVar3 = -dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8207bb);
  *pSVar3 = dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820802);
  *pSVar3 = dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820826);
  *pSVar3 = 0.0;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x82087d);
  *pSVar3 = -dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8208db);
  *pSVar3 = -dVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this_00,(Index)row
                     );
  dVar2 = *pdVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820921);
  *pSVar3 = dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820945);
  *pSVar3 = 0.0;
  SVar1 = *in_RDI;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820979);
  *pSVar3 = SVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x82099d);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8209bb);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x8209d9);
  *pSVar3 = 0.0;
  SVar1 = *in_RDI;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820a0d);
  *pSVar3 = SVar1;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820a31);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820a4f);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820a6d);
  *pSVar3 = 0.0;
  SVar1 = *in_RDI;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                     (this_00,(Index)row,0x820aa1);
  *pSVar3 = SVar1;
  return;
}

Assistant:

void setSpatialMatrix (SpatialMatrix &mat) const {
    mat(0,0) = Ixx; mat(0,1) = Iyx; mat(0,2) = Izx;
    mat(1,0) = Iyx; mat(1,1) = Iyy; mat(1,2) = Izy;
    mat(2,0) = Izx; mat(2,1) = Izy; mat(2,2) = Izz;

    mat(3,0) =    0.; mat(3,1) =  h[2]; mat(3,2) = -h[1];
    mat(4,0) = -h[2]; mat(4,1) =    0.; mat(4,2) =  h[0];
    mat(5,0) =  h[1]; mat(5,1) = -h[0]; mat(5,2) =    0.;

    mat(0,3) =    0.; mat(0,4) = -h[2]; mat(0,5) =  h[1];
    mat(1,3) =  h[2]; mat(1,4) =    0.; mat(1,5) = -h[0];
    mat(2,3) = -h[1]; mat(2,4) =  h[0]; mat(2,5) =    0.;

    mat(3,3) =     m; mat(3,4) =    0.; mat(3,5) =    0.;
    mat(4,3) =    0.; mat(4,4) =     m; mat(4,5) =    0.; 
    mat(5,3) =    0.; mat(5,4) =    0.; mat(5,5) =     m;
  }